

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall MultiObjTestSolver<0>::~MultiObjTestSolver(MultiObjTestSolver<0> *this)

{
  ~MultiObjTestSolver((MultiObjTestSolver<0> *)
                      ((long)&this[-1].super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.
                              super_BasicSolver.warnings_._M_t._M_impl.super__Rb_tree_header + 0x18)
                     );
  return;
}

Assistant:

explicit MultiObjTestSolver()
    : mp::SolverImpl<MultiObjMockProblemBuilder>("", 0, 0, FLAGS), builder(0) {}